

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_consolebuffer.cpp
# Opt level: O2

void __thiscall
FConsoleBuffer::AddText(FConsoleBuffer *this,int printlevel,char *text,FILE *logfile)

{
  size_t tailLen;
  EAddType EVar1;
  FString build;
  
  FString::FString(&build,"\x1cB");
  if (this->mAddType == APPENDLINE) {
    TArray<FString,_FString>::Pop(&this->mConsoleText,&build);
    this->mLastLineNeedsUpdate = true;
  }
  else {
    if (this->mAddType == REPLACELINE) {
      TArray<FString,_FString>::Pop(&this->mConsoleText);
      this->mLastLineNeedsUpdate = true;
    }
    if (printlevel != 2 && -1 < printlevel) {
      if (printlevel == 200) {
        FString::operator=(&build,"\x1cD");
      }
      else if ((uint)printlevel < 5) {
        FString::Format(&build,"%c%c",0x1c,(ulong)(uint)PrintColors[(uint)printlevel]);
      }
    }
  }
  tailLen = strlen(text);
  if (text[tailLen - 1] == '\n') {
    tailLen = tailLen - 1;
    EVar1 = NEWLINE;
  }
  else if (text[tailLen - 1] == '\r') {
    tailLen = tailLen - 1;
    EVar1 = REPLACELINE;
  }
  else {
    EVar1 = APPENDLINE;
  }
  this->mAddType = EVar1;
  FString::AppendCStrPart(&build,text,tailLen);
  TArray<FString,_FString>::Push(&this->mConsoleText,&build);
  if (logfile != (FILE *)0x0) {
    WriteLineToLog(this,logfile,text);
  }
  FString::~FString(&build);
  return;
}

Assistant:

void FConsoleBuffer::AddText(int printlevel, const char *text, FILE *logfile)
{
	FString build = TEXTCOLOR_TAN;
	
	if (mAddType == REPLACELINE)
	{
		// Just wondering: Do we actually need this case? If so, it may need some work.
		mConsoleText.Pop();	// remove the line to be replaced
		mLastLineNeedsUpdate = true;
	}
	else if (mAddType == APPENDLINE)
	{
		mConsoleText.Pop(build);
		printlevel = -1;
		mLastLineNeedsUpdate = true;
	}
	
	if (printlevel >= 0 && printlevel != PRINT_HIGH)
	{
		if (printlevel == 200) build = TEXTCOLOR_GREEN;
		else if (printlevel < PRINTLEVELS) build.Format("%c%c", TEXTCOLOR_ESCAPE, PrintColors[printlevel]);
	}
	
	size_t textsize = strlen(text);
	
	if (text[textsize-1] == '\r')
	{
		textsize--;
		mAddType = REPLACELINE;
	}
	else if (text[textsize-1] == '\n')
	{
		textsize--;
		mAddType = NEWLINE;
	}
	else
	{
		mAddType = APPENDLINE;
	}

	// don't bother about linefeeds etc. inside the text, we'll let the formatter sort this out later.
	build.AppendCStrPart(text, textsize);
	mConsoleText.Push(build);
	if (logfile != NULL) WriteLineToLog(logfile, text);
}